

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * chaiscript::exception::eval_error::format_types_abi_cxx11_
                   (Const_Proxy_Function *t_func,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *pvVar4;
  reference this;
  shared_ptr<chaiscript::AST_Node> *in_RCX;
  byte in_DL;
  char *pcVar5;
  string *in_RDI;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynfunguard;
  Proxy_Function f;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynfun;
  size_t index;
  string paramstr;
  stringstream ss;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  int arity;
  string *retval;
  Dynamic_Proxy_Function *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  shared_ptr<chaiscript::AST_Node> *in_stack_fffffffffffffc88;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_fffffffffffffc90;
  string *__r;
  string local_348 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_fffffffffffffcc8;
  Type_Info *in_stack_fffffffffffffcd0;
  Dispatch_Engine *in_stack_fffffffffffffcd8;
  string local_2f8 [32];
  string local_2d8 [32];
  __shared_ptr local_2b8 [16];
  __shared_ptr local_2a8 [16];
  __shared_ptr local_298 [16];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  stringstream local_200 [16];
  ostream local_1f0 [88];
  shared_ptr<chaiscript::AST_Node> *in_stack_fffffffffffffe68;
  string local_78 [55];
  byte local_41;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_40;
  int local_24;
  shared_ptr<chaiscript::AST_Node> *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  __r = in_RDI;
  local_20 = in_RCX;
  peVar2 = std::
           __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x21aac4);
  local_24 = chaiscript::dispatch::Proxy_Function_Base::get_arity(peVar2);
  peVar2 = std::
           __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x21aae0);
  chaiscript::dispatch::Proxy_Function_Base::get_param_types(peVar2);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
             in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_41 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  if (local_24 == -1) {
    std::__cxx11::string::operator=((string *)in_RDI,"(...)");
    if ((local_11 & 1) != 0) {
      std::operator+((char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::__cxx11::string::operator=((string *)in_RDI,local_78);
      std::__cxx11::string::~string(local_78);
    }
  }
  else {
    sVar3 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                      (&local_40);
    if (sVar3 < 2) {
      std::__cxx11::string::operator=((string *)in_RDI,"()");
    }
    else {
      std::__cxx11::stringstream::stringstream(local_200);
      std::operator<<(local_1f0,"(");
      std::__cxx11::string::string((string *)&local_220);
      local_228 = (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)0x1;
      while (in_stack_fffffffffffffc90 = local_228,
            pvVar4 = (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                     std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                     size(&local_40), in_stack_fffffffffffffc90 != pvVar4) {
        this = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
               operator[](&local_40,(size_type)local_228);
        bVar1 = Type_Info::is_const(this);
        pcVar5 = "";
        if (bVar1) {
          pcVar5 = "const ";
        }
        std::__cxx11::string::operator+=((string *)&local_220,pcVar5);
        in_stack_fffffffffffffc88 = local_20;
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::operator[]
                  (&local_40,(size_type)local_228);
        chaiscript::detail::Dispatch_Engine::get_type_name_abi_cxx11_
                  (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
        std::__cxx11::string::operator+=((string *)&local_220,local_248);
        std::__cxx11::string::~string(local_248);
        if ((local_228 ==
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)0x1) &&
           ((local_11 & 1) != 0)) {
          std::__cxx11::string::operator+=((string *)&local_220,").(");
          sVar3 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                            (&local_40);
          if (sVar3 == 2) {
            std::__cxx11::string::operator+=((string *)&local_220,", ");
          }
        }
        else {
          std::__cxx11::string::operator+=((string *)&local_220,", ");
        }
        local_228 = (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                    ((long)&(local_228->
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
      }
      in_stack_fffffffffffffc78 = (Dynamic_Proxy_Function *)local_1f0;
      in_stack_fffffffffffffc80 = &local_220;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_268,(ulong)in_stack_fffffffffffffc80);
      std::operator<<((ostream *)in_stack_fffffffffffffc78,local_268);
      std::__cxx11::string::~string(local_268);
      std::operator<<(local_1f0,")");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)in_RDI,local_288);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::stringstream::~stringstream(local_200);
    }
  }
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base_const>
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)__r);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_298);
  if (bVar1) {
    std::
    __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x21aee8);
    chaiscript::dispatch::Dynamic_Proxy_Function::get_guard(in_stack_fffffffffffffc78);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_2a8);
    if (bVar1) {
      std::
      dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
                ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)__r);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
      if (bVar1) {
        std::
        __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x21af48);
        chaiscript::dispatch::Dynamic_Proxy_Function::get_parse_tree(in_stack_fffffffffffffc78);
        format_guard<std::shared_ptr<chaiscript::AST_Node>>(in_stack_fffffffffffffc88);
        std::operator+((char *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
        std::__cxx11::string::operator+=((string *)in_RDI,local_2d8);
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string(local_2f8);
        std::shared_ptr<chaiscript::AST_Node>::~shared_ptr
                  ((shared_ptr<chaiscript::AST_Node> *)0x21afca);
      }
      std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
                ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)0x21b074);
    }
    std::
    __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x21b095);
    chaiscript::dispatch::Dynamic_Proxy_Function::get_parse_tree(in_stack_fffffffffffffc78);
    format_location<std::shared_ptr<chaiscript::AST_Node>>(in_stack_fffffffffffffe68);
    std::operator+((char *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xfffffffffffffcd8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd8);
    std::__cxx11::string::~string(local_348);
    std::shared_ptr<chaiscript::AST_Node>::~shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x21b0fc)
    ;
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x21b109);
  }
  local_41 = 1;
  std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)0x21b1a6);
  if ((local_41 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            (in_stack_fffffffffffffc90);
  return __r;
}

Assistant:

static std::string format_types(const Const_Proxy_Function &t_func,
          bool t_dot_notation,
          const chaiscript::detail::Dispatch_Engine &t_ss)
      {
        int arity = t_func->get_arity();
        std::vector<Type_Info> types = t_func->get_param_types();

        std::string retval;
        if (arity == -1)
        {
          retval = "(...)";
          if (t_dot_notation)
          {
            retval = "(Object)." + retval;
          }
        } else if (types.size() <= 1) {
          retval = "()";
        } else {
          std::stringstream ss;
          ss << "(";

          std::string paramstr;

          for (size_t index = 1;
               index != types.size();
               ++index)
          {
            paramstr += (types[index].is_const()?"const ":"");
            paramstr += t_ss.get_type_name(types[index]);

            if (index == 1 && t_dot_notation)
            {
              paramstr += ").(";
              if (types.size() == 2)
              {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);

          ss << ")";
          retval = ss.str();
        }


        std::shared_ptr<const dispatch::Dynamic_Proxy_Function> dynfun 
          = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_func);

        if (dynfun)
        {
          Proxy_Function f = dynfun->get_guard();

          if (f)
          {
            auto dynfunguard = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(f);
            if (dynfunguard)
            {
              retval += " : " + format_guard(dynfunguard->get_parse_tree());
            }
          }

          retval += "\n          Defined at " + format_location(dynfun->get_parse_tree());        
        }

        return retval;
      }